

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# gtest-internal.h
# Opt level: O3

bool testing::internal::
     TypeParameterizedTestSuite<(anonymous_namespace)::UnsignedToString,_testing::internal::Templates<gtest_suite_UnsignedToString_::Ten,_gtest_suite_UnsignedToString_::Max>,_testing::internal::Types<unsigned_char,_unsigned_int,_unsigned_long,_unsigned_long_long>_>
     ::Register(char *prefix,CodeLocation *code_location,TypedTestSuitePState *state,char *case_name
               ,char *test_names,
               vector<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::allocator<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>_>
               *type_names)

{
  byte *pbVar1;
  pointer pcVar2;
  _Alloc_hider _Var3;
  CodeLocation *pCVar4;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar5;
  int iVar6;
  char *pcVar7;
  const_iterator cVar8;
  CodeLocation *pCVar9;
  long *plVar10;
  SetUpTearDownSuiteFuncType p_Var11;
  SetUpTearDownSuiteFuncType p_Var12;
  TestFactoryBase *pTVar13;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *extraout_RAX;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *paVar14;
  undefined8 extraout_RAX_00;
  long *plVar15;
  size_type *psVar16;
  type_info *extraout_RDX;
  type_info *extraout_RDX_00;
  type_info *extraout_RDX_01;
  type_info *extraout_RDX_02;
  type_info *extraout_RDX_03;
  type_info *extraout_RDX_04;
  type_info *extraout_RDX_05;
  type_info *extraout_RDX_06;
  type_info *extraout_RDX_07;
  type_info *extraout_RDX_08;
  type_info *extraout_RDX_09;
  type_info *extraout_RDX_10;
  type_info *extraout_RDX_11;
  type_info *extraout_RDX_12;
  type_info *extraout_RDX_13;
  type_info *extraout_RDX_14;
  type_info *extraout_RDX_15;
  type_info *extraout_RDX_16;
  type_info *extraout_RDX_17;
  type_info *extraout_RDX_18;
  type_info *extraout_RDX_19;
  type_info *extraout_RDX_20;
  type_info *extraout_RDX_21;
  type_info *extraout_RDX_22;
  type_info *extraout_RDX_23;
  type_info *extraout_RDX_24;
  type_info *extraout_RDX_25;
  type_info *extraout_RDX_26;
  type_info *extraout_RDX_27;
  type_info *extraout_RDX_28;
  type_info *extraout_RDX_29;
  type_info *extraout_RDX_30;
  type_info *ptVar17;
  char *pcVar18;
  undefined1 *puVar19;
  long *plVar20;
  char *pcVar21;
  char *pcVar22;
  ulong uVar23;
  long *local_2f8;
  long local_2f0;
  long local_2e8;
  long lStack_2e0;
  long *local_2d8;
  long local_2d0;
  long local_2c8;
  long lStack_2c0;
  long *local_2b8;
  long local_2b0;
  long local_2a8;
  long lStack_2a0;
  CodeLocation local_298;
  string local_270;
  CodeLocation *local_250;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_248;
  CodeLocation local_240;
  string local_218;
  long *local_1f8;
  long local_1f0;
  undefined1 local_1e8;
  undefined7 uStack_1e7;
  long lStack_1e0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1d8;
  size_type local_1d0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1c8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_1b8;
  size_type local_1b0;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_1a8;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  *local_198;
  size_type local_190;
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_188;
  TypedTestSuitePState *local_178;
  CodeLocation local_170;
  string local_148;
  CodeLocation local_128;
  char *local_100;
  size_type local_f8;
  char local_f0;
  undefined7 uStack_ef;
  undefined8 uStack_e8;
  char *local_e0;
  size_type local_d8;
  char local_d0;
  undefined7 uStack_cf;
  undefined8 uStack_c8;
  string local_c0;
  long *local_a0;
  string test_name;
  string test_name_1;
  internal *local_58 [2];
  long local_48 [2];
  uint local_38;
  
  local_178 = state;
  RegisterTypeParameterizedTestSuiteInstantiation("UnsignedToString");
  pcVar7 = strchr((char *)code_location,0x2c);
  local_250 = code_location;
  if (pcVar7 == (char *)0x0) {
    std::__cxx11::string::string((string *)&local_100,(char *)code_location,(allocator *)&local_298)
    ;
  }
  else {
    local_100 = &local_f0;
    std::__cxx11::string::_M_construct<char_const*>((string *)&local_100,code_location,pcVar7);
  }
  test_name._M_dataplus._M_p = local_100;
  if (local_f8 != 0) {
    pcVar7 = local_100 + local_f8;
    do {
      pcVar21 = local_100;
      iVar6 = isspace((uint)(byte)pcVar7[-1]);
      test_name._M_dataplus._M_p = pcVar21;
      if (iVar6 == 0) break;
      pcVar18 = pcVar7 + -1;
      uVar23 = (long)pcVar18 - (long)pcVar21;
      std::__cxx11::string::_M_erase((ulong)&local_100,uVar23);
      pcVar7 = local_100 + uVar23;
      test_name._M_dataplus._M_p = local_100;
    } while (pcVar18 != pcVar21);
  }
  local_100 = &local_f0;
  if (test_name._M_dataplus._M_p == local_100) {
    test_name.field_2._8_8_ = uStack_e8;
    test_name._M_dataplus._M_p = (pointer)&test_name.field_2;
  }
  test_name.field_2._M_allocated_capacity._1_7_ = uStack_ef;
  test_name.field_2._M_local_buf[0] = local_f0;
  test_name._M_string_length = local_f8;
  local_f8 = 0;
  local_f0 = '\0';
  cVar8 = std::
          _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
          ::find(&gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t,&test_name
                );
  iVar6 = 0x23e858;
  if ((_Rb_tree_header *)cVar8._M_node ==
      &gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t._M_impl.
       super__Rb_tree_header) {
    FormatFileLocation_abi_cxx11_
              (&local_298.file,*(internal **)prefix,(char *)(ulong)*(uint *)(prefix + 0x20),0x23e858
              );
    TypeParameterizedTestSuite<(anonymous_namespace)::UnsignedToString,testing::internal::Templates<gtest_suite_UnsignedToString_::Ten,gtest_suite_UnsignedToString_::Max>,testing::internal::Types<unsigned_char,unsigned_int,unsigned_long,unsigned_long_long>>
    ::Register();
  }
  else {
    pCVar9 = TypedTestSuitePState::GetCodeLocation
                       (&gtest_typed_test_suite_p_state_UnsignedToString_,&test_name);
    local_2d8 = &local_2c8;
    local_2c8 = CONCAT44(local_2c8._4_4_,0x533255);
    local_2d0 = 3;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    local_2f8 = &local_2e8;
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_2e8 = *plVar15;
      lStack_2e0 = plVar10[3];
    }
    else {
      local_2e8 = *plVar15;
      local_2f8 = (long *)*plVar10;
    }
    local_2f0 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    local_170.file._M_dataplus._M_p = (pointer)&local_170.file.field_2;
    psVar16 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_170.file.field_2._M_allocated_capacity = *psVar16;
      local_170.file.field_2._8_8_ = plVar10[3];
    }
    else {
      local_170.file.field_2._M_allocated_capacity = *psVar16;
      local_170.file._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_170.file._M_string_length = plVar10[1];
    *plVar10 = (long)psVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_170);
    local_240.file._M_dataplus._M_p = (pointer)&local_240.file.field_2;
    psVar16 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_240.file.field_2._M_allocated_capacity = *psVar16;
      local_240.file.field_2._8_8_ = plVar10[3];
    }
    else {
      local_240.file.field_2._M_allocated_capacity = *psVar16;
      local_240.file._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_240.file._M_string_length = plVar10[1];
    *plVar10 = (long)psVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_240,**(ulong **)local_178);
    pCVar4 = local_250;
    local_298.file._M_dataplus._M_p = (pointer)&local_298.file.field_2;
    psVar16 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_298.file.field_2._M_allocated_capacity = *psVar16;
      local_298.file.field_2._8_8_ = plVar10[3];
    }
    else {
      local_298.file.field_2._M_allocated_capacity = *psVar16;
      local_298.file._M_dataplus._M_p = (pointer)*plVar10;
    }
    _Var3._M_p = local_298.file._M_dataplus._M_p;
    local_298.file._M_string_length = plVar10[1];
    *plVar10 = (long)psVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    pcVar7 = strchr((char *)local_250,0x2c);
    local_a0 = (long *)prefix;
    if (pcVar7 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_1f8,(char *)pCVar4,(allocator *)&local_128);
      ptVar17 = extraout_RDX_00;
    }
    else {
      local_1f8 = (long *)&local_1e8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pCVar4,pcVar7);
      ptVar17 = extraout_RDX;
    }
    local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var3._M_p;
    plVar10 = local_1f8;
    if (local_1f0 != 0) {
      puVar19 = (undefined1 *)((long)local_1f8 + local_1f0);
      do {
        plVar15 = local_1f8;
        iVar6 = isspace((uint)(byte)puVar19[-1]);
        ptVar17 = extraout_RDX_01;
        plVar10 = plVar15;
        if (iVar6 == 0) break;
        plVar20 = (long *)(puVar19 + -1);
        uVar23 = (long)plVar20 - (long)plVar15;
        std::__cxx11::string::_M_erase((ulong)&local_1f8,uVar23);
        puVar19 = (undefined1 *)((long)local_1f8 + uVar23);
        ptVar17 = extraout_RDX_02;
        plVar10 = local_1f8;
      } while (plVar20 != plVar15);
    }
    pCVar4 = local_250;
    local_1f8 = (long *)&local_1e8;
    if (plVar10 == local_1f8) {
      lStack_2a0 = lStack_1e0;
      plVar10 = &local_2a8;
    }
    local_2a8 = CONCAT71(uStack_1e7,local_1e8);
    local_2b0 = local_1f0;
    local_1f0 = 0;
    local_1e8 = 0;
    local_2b8 = plVar10;
    GetTypeName_abi_cxx11_(&local_270,(internal *)&unsigned_char::typeinfo,ptVar17);
    _Var3._M_p = local_270._M_dataplus._M_p;
    local_128.file._M_dataplus._M_p = (pointer)&local_128.file.field_2;
    pcVar2 = (pCVar9->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_128,pcVar2,pcVar2 + (pCVar9->file)._M_string_length);
    local_128.line = pCVar9->line;
    p_Var11 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_char>_>::
              GetSetUpCaseOrSuite((pCVar9->file)._M_dataplus._M_p,local_128.line);
    p_Var12 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_char>_>::
              GetTearDownCaseOrSuite((pCVar9->file)._M_dataplus._M_p,pCVar9->line);
    pTVar13 = (TestFactoryBase *)operator_new(8);
    pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00236ed0;
    MakeAndRegisterTestInfo
              (local_248->_M_local_buf,(char *)plVar10,_Var3._M_p,(char *)0x0,&local_128,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_char>>::dummy_,p_Var11
               ,p_Var12,pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_128.file._M_dataplus._M_p != &local_128.file.field_2) {
      operator_delete(local_128.file._M_dataplus._M_p,
                      local_128.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    if (local_1f8 != (long *)&local_1e8) {
      operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.file._M_dataplus._M_p != &local_298.file.field_2) {
      operator_delete(local_298.file._M_dataplus._M_p,
                      local_298.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.file._M_dataplus._M_p != &local_240.file.field_2) {
      operator_delete(local_240.file._M_dataplus._M_p,
                      local_240.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.file._M_dataplus._M_p != &local_170.file.field_2) {
      operator_delete(local_170.file._M_dataplus._M_p,
                      local_170.file.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    local_2b8 = &local_2a8;
    local_2a8 = CONCAT44(local_2a8._4_4_,0x533255);
    local_2b0 = 3;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_2d8 = &local_2c8;
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_2c8 = *plVar15;
      lStack_2c0 = plVar10[3];
    }
    else {
      local_2c8 = *plVar15;
      local_2d8 = (long *)*plVar10;
    }
    local_2d0 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    local_2f8 = &local_2e8;
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_2e8 = *plVar15;
      lStack_2e0 = plVar10[3];
    }
    else {
      local_2e8 = *plVar15;
      local_2f8 = (long *)*plVar10;
    }
    local_2f0 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2f8);
    local_240.file._M_dataplus._M_p = (pointer)&local_240.file.field_2;
    psVar16 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_240.file.field_2._M_allocated_capacity = *psVar16;
      local_240.file.field_2._8_8_ = plVar10[3];
    }
    else {
      local_240.file.field_2._M_allocated_capacity = *psVar16;
      local_240.file._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_240.file._M_string_length = plVar10[1];
    *plVar10 = (long)psVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_240,*(ulong *)(*(long *)local_178 + 0x20));
    local_298.file._M_dataplus._M_p = (pointer)&local_298.file.field_2;
    psVar16 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_298.file.field_2._M_allocated_capacity = *psVar16;
      local_298.file.field_2._8_8_ = plVar10[3];
    }
    else {
      local_298.file.field_2._M_allocated_capacity = *psVar16;
      local_298.file._M_dataplus._M_p = (pointer)*plVar10;
    }
    _Var3._M_p = local_298.file._M_dataplus._M_p;
    local_298.file._M_string_length = plVar10[1];
    *plVar10 = (long)psVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    pcVar7 = strchr((char *)pCVar4,0x2c);
    if (pcVar7 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_1d8,(char *)pCVar4,(allocator *)&local_170);
      ptVar17 = extraout_RDX_04;
    }
    else {
      local_1d8 = &local_1c8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pCVar4,pcVar7);
      ptVar17 = extraout_RDX_03;
    }
    local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var3._M_p;
    paVar14 = local_1d8;
    if (local_1d0 != 0) {
      pcVar7 = local_1d8->_M_local_buf + local_1d0;
      do {
        paVar5 = local_1d8;
        iVar6 = isspace((uint)(byte)pcVar7[-1]);
        ptVar17 = extraout_RDX_05;
        paVar14 = paVar5;
        if (iVar6 == 0) break;
        pcVar21 = pcVar7 + -1;
        uVar23 = (long)pcVar21 - (long)paVar5;
        std::__cxx11::string::_M_erase((ulong)&local_1d8,uVar23);
        pcVar7 = local_1d8->_M_local_buf + uVar23;
        ptVar17 = extraout_RDX_06;
        paVar14 = local_1d8;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar21 != paVar5);
    }
    pCVar4 = local_250;
    local_1d8 = &local_1c8;
    if (paVar14 == local_1d8) {
      local_270.field_2._8_8_ = local_1c8._8_8_;
      paVar14 = &local_270.field_2;
    }
    local_270.field_2._M_allocated_capacity._1_7_ = local_1c8._M_allocated_capacity._1_7_;
    local_270.field_2._M_local_buf[0] = local_1c8._M_local_buf[0];
    local_270._M_string_length = local_1d0;
    local_1d0 = 0;
    local_1c8._M_local_buf[0] = '\0';
    local_270._M_dataplus._M_p = (pointer)paVar14;
    GetTypeName_abi_cxx11_(&local_218,(internal *)&unsigned_int::typeinfo,ptVar17);
    _Var3._M_p = local_218._M_dataplus._M_p;
    local_170.file._M_dataplus._M_p = (pointer)&local_170.file.field_2;
    pcVar2 = (pCVar9->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_170,pcVar2,pcVar2 + (pCVar9->file)._M_string_length);
    local_170.line = pCVar9->line;
    p_Var11 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_int>_>::
              GetSetUpCaseOrSuite((pCVar9->file)._M_dataplus._M_p,local_170.line);
    p_Var12 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_int>_>::
              GetTearDownCaseOrSuite((pCVar9->file)._M_dataplus._M_p,pCVar9->line);
    pTVar13 = (TestFactoryBase *)operator_new(8);
    pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00236f68;
    MakeAndRegisterTestInfo
              (local_248->_M_local_buf,paVar14->_M_local_buf,_Var3._M_p,(char *)0x0,&local_170,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_int>>::dummy_,p_Var11,
               p_Var12,pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_170.file._M_dataplus._M_p != &local_170.file.field_2) {
      operator_delete(local_170.file._M_dataplus._M_p,
                      local_170.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if (local_1d8 != &local_1c8) {
      operator_delete(local_1d8,
                      CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.file._M_dataplus._M_p != &local_298.file.field_2) {
      operator_delete(local_298.file._M_dataplus._M_p,
                      local_298.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.file._M_dataplus._M_p != &local_240.file.field_2) {
      operator_delete(local_240.file._M_dataplus._M_p,
                      local_240.file.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    local_270.field_2._M_allocated_capacity._0_4_ = 0x533255;
    local_270._M_string_length = 3;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2b8 = &local_2a8;
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_2a8 = *plVar15;
      lStack_2a0 = plVar10[3];
    }
    else {
      local_2a8 = *plVar15;
      local_2b8 = (long *)*plVar10;
    }
    local_2b0 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_2d8 = &local_2c8;
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_2c8 = *plVar15;
      lStack_2c0 = plVar10[3];
    }
    else {
      local_2c8 = *plVar15;
      local_2d8 = (long *)*plVar10;
    }
    local_2d0 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d8);
    local_2f8 = &local_2e8;
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_2e8 = *plVar15;
      lStack_2e0 = plVar10[3];
    }
    else {
      local_2e8 = *plVar15;
      local_2f8 = (long *)*plVar10;
    }
    local_2f0 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_2f8,*(ulong *)(*(long *)local_178 + 0x40));
    local_298.file._M_dataplus._M_p = (pointer)&local_298.file.field_2;
    psVar16 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_298.file.field_2._M_allocated_capacity = *psVar16;
      local_298.file.field_2._8_8_ = plVar10[3];
    }
    else {
      local_298.file.field_2._M_allocated_capacity = *psVar16;
      local_298.file._M_dataplus._M_p = (pointer)*plVar10;
    }
    _Var3._M_p = local_298.file._M_dataplus._M_p;
    local_298.file._M_string_length = plVar10[1];
    *plVar10 = (long)psVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    pcVar7 = strchr((char *)pCVar4,0x2c);
    if (pcVar7 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_1b8,(char *)pCVar4,(allocator *)&local_240);
      ptVar17 = extraout_RDX_08;
    }
    else {
      local_1b8 = &local_1a8;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,pCVar4,pcVar7);
      ptVar17 = extraout_RDX_07;
    }
    local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)_Var3._M_p;
    paVar14 = local_1b8;
    if (local_1b0 != 0) {
      pcVar7 = local_1b8->_M_local_buf + local_1b0;
      do {
        paVar5 = local_1b8;
        iVar6 = isspace((uint)(byte)pcVar7[-1]);
        ptVar17 = extraout_RDX_09;
        paVar14 = paVar5;
        if (iVar6 == 0) break;
        pcVar21 = pcVar7 + -1;
        uVar23 = (long)pcVar21 - (long)paVar5;
        std::__cxx11::string::_M_erase((ulong)&local_1b8,uVar23);
        pcVar7 = local_1b8->_M_local_buf + uVar23;
        ptVar17 = extraout_RDX_10;
        paVar14 = local_1b8;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar21 != paVar5);
    }
    pCVar4 = local_250;
    local_1b8 = &local_1a8;
    if (paVar14 == local_1b8) {
      local_218.field_2._8_8_ = local_1a8._8_8_;
      paVar14 = &local_218.field_2;
    }
    local_218.field_2._M_allocated_capacity._1_7_ = local_1a8._M_allocated_capacity._1_7_;
    local_218.field_2._M_local_buf[0] = local_1a8._M_local_buf[0];
    local_218._M_string_length = local_1b0;
    local_1b0 = 0;
    local_1a8._M_local_buf[0] = '\0';
    local_218._M_dataplus._M_p = (pointer)paVar14;
    GetTypeName_abi_cxx11_(&local_148,(internal *)&unsigned_long::typeinfo,ptVar17);
    _Var3._M_p = local_148._M_dataplus._M_p;
    local_240.file._M_dataplus._M_p = (pointer)&local_240.file.field_2;
    pcVar2 = (pCVar9->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_240,pcVar2,pcVar2 + (pCVar9->file)._M_string_length);
    local_240.line = pCVar9->line;
    p_Var11 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long>_>::
              GetSetUpCaseOrSuite((pCVar9->file)._M_dataplus._M_p,local_240.line);
    p_Var12 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long>_>::
              GetTearDownCaseOrSuite((pCVar9->file)._M_dataplus._M_p,pCVar9->line);
    pTVar13 = (TestFactoryBase *)operator_new(8);
    pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00237000;
    MakeAndRegisterTestInfo
              (local_248->_M_local_buf,paVar14->_M_local_buf,_Var3._M_p,(char *)0x0,&local_240,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long>>::dummy_,p_Var11
               ,p_Var12,pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_240.file._M_dataplus._M_p != &local_240.file.field_2) {
      operator_delete(local_240.file._M_dataplus._M_p,
                      local_240.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    if (local_1b8 != &local_1a8) {
      operator_delete(local_1b8,
                      CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) + 1)
      ;
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.file._M_dataplus._M_p != &local_298.file.field_2) {
      operator_delete(local_298.file._M_dataplus._M_p,
                      local_298.file.field_2._M_allocated_capacity + 1);
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
    local_218.field_2._M_allocated_capacity._0_4_ = 0x533255;
    local_218._M_string_length = 3;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_218);
    local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
    psVar16 = (size_type *)(plVar10 + 2);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)*plVar10 ==
        (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)psVar16) {
      local_270.field_2._M_allocated_capacity = *psVar16;
      local_270.field_2._8_8_ = plVar10[3];
    }
    else {
      local_270.field_2._M_allocated_capacity = *psVar16;
      local_270._M_dataplus._M_p = (pointer)*plVar10;
    }
    local_270._M_string_length = plVar10[1];
    *plVar10 = (long)psVar16;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
    local_2b8 = &local_2a8;
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_2a8 = *plVar15;
      lStack_2a0 = plVar10[3];
    }
    else {
      local_2a8 = *plVar15;
      local_2b8 = (long *)*plVar10;
    }
    local_2b0 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b8);
    local_2d8 = &local_2c8;
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_2c8 = *plVar15;
      lStack_2c0 = plVar10[3];
    }
    else {
      local_2c8 = *plVar15;
      local_2d8 = (long *)*plVar10;
    }
    local_2d0 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    plVar10 = (long *)std::__cxx11::string::_M_append
                                ((char *)&local_2d8,*(ulong *)(*(long *)local_178 + 0x60));
    local_2f8 = &local_2e8;
    plVar15 = plVar10 + 2;
    if ((long *)*plVar10 == plVar15) {
      local_2e8 = *plVar15;
      lStack_2e0 = plVar10[3];
    }
    else {
      local_2e8 = *plVar15;
      local_2f8 = (long *)*plVar10;
    }
    plVar20 = local_2f8;
    local_2f0 = plVar10[1];
    *plVar10 = (long)plVar15;
    plVar10[1] = 0;
    *(undefined1 *)(plVar10 + 2) = 0;
    pcVar7 = strchr((char *)pCVar4,0x2c);
    if (pcVar7 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_198,(char *)pCVar4,(allocator *)&local_298);
      ptVar17 = extraout_RDX_12;
    }
    else {
      local_198 = &local_188;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,pCVar4,pcVar7);
      ptVar17 = extraout_RDX_11;
    }
    local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                 *)plVar20;
    paVar14 = local_198;
    if (local_190 != 0) {
      pcVar7 = local_198->_M_local_buf + local_190;
      do {
        paVar5 = local_198;
        iVar6 = isspace((uint)(byte)pcVar7[-1]);
        ptVar17 = extraout_RDX_13;
        paVar14 = paVar5;
        if (iVar6 == 0) break;
        pcVar21 = pcVar7 + -1;
        uVar23 = (long)pcVar21 - (long)paVar5;
        std::__cxx11::string::_M_erase((ulong)&local_198,uVar23);
        pcVar7 = local_198->_M_local_buf + uVar23;
        ptVar17 = extraout_RDX_14;
        paVar14 = local_198;
      } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                *)pcVar21 != paVar5);
    }
    plVar10 = local_a0;
    local_198 = &local_188;
    if (paVar14 == local_198) {
      local_148.field_2._8_8_ = local_188._8_8_;
      paVar14 = &local_148.field_2;
    }
    local_148.field_2._M_allocated_capacity._1_7_ = local_188._M_allocated_capacity._1_7_;
    local_148.field_2._M_local_buf[0] = local_188._M_local_buf[0];
    local_148._M_string_length = local_190;
    local_190 = 0;
    local_188._M_local_buf[0] = '\0';
    local_148._M_dataplus._M_p = (pointer)paVar14;
    GetTypeName_abi_cxx11_(&local_c0,(internal *)&unsigned_long_long::typeinfo,ptVar17);
    _Var3._M_p = local_c0._M_dataplus._M_p;
    local_298.file._M_dataplus._M_p = (pointer)&local_298.file.field_2;
    pcVar2 = (pCVar9->file)._M_dataplus._M_p;
    std::__cxx11::string::_M_construct<char*>
              ((string *)&local_298,pcVar2,pcVar2 + (pCVar9->file)._M_string_length);
    local_298.line = pCVar9->line;
    p_Var11 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long_long>_>::
              GetSetUpCaseOrSuite((pCVar9->file)._M_dataplus._M_p,local_298.line);
    p_Var12 = SuiteApiResolver<gtest_suite_UnsignedToString_::Ten<unsigned_long_long>_>::
              GetTearDownCaseOrSuite((pCVar9->file)._M_dataplus._M_p,pCVar9->line);
    pTVar13 = (TestFactoryBase *)operator_new(8);
    pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00237098;
    MakeAndRegisterTestInfo
              ((char *)local_248,paVar14->_M_local_buf,_Var3._M_p,(char *)0x0,&local_298,
               &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long_long>>::dummy_,
               p_Var11,p_Var12,pTVar13);
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_298.file._M_dataplus._M_p != &local_298.file.field_2) {
      operator_delete(local_298.file._M_dataplus._M_p,
                      local_298.file.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
      operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_148._M_dataplus._M_p != &local_148.field_2) {
      operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
    }
    if (local_198 != &local_188) {
      operator_delete(local_198,
                      CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) + 1)
      ;
    }
    if (local_2f8 != &local_2e8) {
      operator_delete(local_2f8,local_2e8 + 1);
    }
    if (local_2d8 != &local_2c8) {
      operator_delete(local_2d8,local_2c8 + 1);
    }
    if (local_2b8 != &local_2a8) {
      operator_delete(local_2b8,local_2a8 + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_270._M_dataplus._M_p != &local_270.field_2) {
      operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
    }
    if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
         *)local_218._M_dataplus._M_p != &local_218.field_2) {
      operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
    }
    local_58[0] = (internal *)local_48;
    std::__cxx11::string::_M_construct<char*>((string *)local_58,*plVar10,plVar10[1] + *plVar10);
    local_38 = *(uint *)(plVar10 + 4);
    pcVar7 = strchr((char *)local_250,0x2c);
    if (pcVar7 == (char *)0x0) {
      pcVar7 = (char *)0x0;
    }
    else {
      do {
        pbVar1 = (byte *)(pcVar7 + 1);
        pcVar7 = pcVar7 + 1;
        iVar6 = isspace((uint)*pbVar1);
      } while (iVar6 != 0);
    }
    RegisterTypeParameterizedTestSuiteInstantiation("UnsignedToString");
    pcVar21 = strchr(pcVar7,0x2c);
    if (pcVar21 == (char *)0x0) {
      std::__cxx11::string::string((string *)&local_e0,pcVar7,(allocator *)&local_298);
    }
    else {
      local_e0 = &local_d0;
      std::__cxx11::string::_M_construct<char_const*>((string *)&local_e0,pcVar7,pcVar21);
    }
    test_name_1._M_dataplus._M_p = local_e0;
    if (local_d8 != 0) {
      pcVar21 = local_e0 + local_d8;
      do {
        pcVar18 = local_e0;
        iVar6 = isspace((uint)(byte)pcVar21[-1]);
        test_name_1._M_dataplus._M_p = pcVar18;
        if (iVar6 == 0) break;
        pcVar22 = pcVar21 + -1;
        uVar23 = (long)pcVar22 - (long)pcVar18;
        std::__cxx11::string::_M_erase((ulong)&local_e0,uVar23);
        pcVar21 = local_e0 + uVar23;
        test_name_1._M_dataplus._M_p = local_e0;
      } while (pcVar22 != pcVar18);
    }
    local_e0 = &local_d0;
    if (test_name_1._M_dataplus._M_p == local_e0) {
      test_name_1.field_2._8_8_ = uStack_c8;
      test_name_1._M_dataplus._M_p = (pointer)&test_name_1.field_2;
    }
    test_name_1.field_2._M_allocated_capacity._1_7_ = uStack_cf;
    test_name_1.field_2._M_local_buf[0] = local_d0;
    test_name_1._M_string_length = local_d8;
    local_d8 = 0;
    local_d0 = '\0';
    cVar8 = std::
            _Rb_tree<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>,_std::_Select1st<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>,_std::less<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_>,_std::allocator<std::pair<const_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_testing::internal::CodeLocation>_>_>
            ::find(&gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t,
                   &test_name_1);
    iVar6 = 0x23e858;
    if ((_Rb_tree_header *)cVar8._M_node !=
        &gtest_typed_test_suite_p_state_UnsignedToString_.registered_tests_._M_t._M_impl.
         super__Rb_tree_header) {
      pCVar9 = TypedTestSuitePState::GetCodeLocation
                         (&gtest_typed_test_suite_p_state_UnsignedToString_,&test_name_1);
      local_2d8 = &local_2c8;
      local_2c8 = CONCAT44(local_2c8._4_4_,0x533255);
      local_2d0 = 3;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_2f8 = &local_2e8;
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_2e8 = *plVar15;
        lStack_2e0 = plVar10[3];
      }
      else {
        local_2e8 = *plVar15;
        local_2f8 = (long *)*plVar10;
      }
      local_2f0 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_170.file._M_dataplus._M_p = (pointer)&local_170.file.field_2;
      psVar16 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_170.file.field_2._M_allocated_capacity = *psVar16;
        local_170.file.field_2._8_8_ = plVar10[3];
      }
      else {
        local_170.file.field_2._M_allocated_capacity = *psVar16;
        local_170.file._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_170.file._M_string_length = plVar10[1];
      *plVar10 = (long)psVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_170);
      local_240.file._M_dataplus._M_p = (pointer)&local_240.file.field_2;
      psVar16 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_240.file.field_2._M_allocated_capacity = *psVar16;
        local_240.file.field_2._8_8_ = plVar10[3];
      }
      else {
        local_240.file.field_2._M_allocated_capacity = *psVar16;
        local_240.file._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_240.file._M_string_length = plVar10[1];
      *plVar10 = (long)psVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append((char *)&local_240,**(ulong **)local_178);
      local_298.file._M_dataplus._M_p = (pointer)&local_298.file.field_2;
      psVar16 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_298.file.field_2._M_allocated_capacity = *psVar16;
        local_298.file.field_2._8_8_ = plVar10[3];
      }
      else {
        local_298.file.field_2._M_allocated_capacity = *psVar16;
        local_298.file._M_dataplus._M_p = (pointer)*plVar10;
      }
      _Var3._M_p = local_298.file._M_dataplus._M_p;
      local_298.file._M_string_length = plVar10[1];
      *plVar10 = (long)psVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pcVar21 = strchr(pcVar7,0x2c);
      local_250 = pCVar9;
      if (pcVar21 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_1f8,pcVar7,(allocator *)&local_128);
        ptVar17 = extraout_RDX_16;
      }
      else {
        local_1f8 = (long *)&local_1e8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1f8,pcVar7,pcVar21);
        ptVar17 = extraout_RDX_15;
      }
      local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var3._M_p;
      plVar10 = local_1f8;
      if (local_1f0 != 0) {
        puVar19 = (undefined1 *)((long)local_1f8 + local_1f0);
        do {
          plVar15 = local_1f8;
          iVar6 = isspace((uint)(byte)puVar19[-1]);
          ptVar17 = extraout_RDX_17;
          plVar10 = plVar15;
          if (iVar6 == 0) break;
          plVar20 = (long *)(puVar19 + -1);
          uVar23 = (long)plVar20 - (long)plVar15;
          std::__cxx11::string::_M_erase((ulong)&local_1f8,uVar23);
          puVar19 = (undefined1 *)((long)local_1f8 + uVar23);
          ptVar17 = extraout_RDX_18;
          plVar10 = local_1f8;
        } while (plVar20 != plVar15);
      }
      pCVar9 = local_250;
      local_1f8 = (long *)&local_1e8;
      if (plVar10 == local_1f8) {
        lStack_2a0 = lStack_1e0;
        plVar10 = &local_2a8;
      }
      local_2a8 = CONCAT71(uStack_1e7,local_1e8);
      local_2b0 = local_1f0;
      local_1f0 = 0;
      local_1e8 = 0;
      local_2b8 = plVar10;
      GetTypeName_abi_cxx11_(&local_270,(internal *)&unsigned_char::typeinfo,ptVar17);
      _Var3._M_p = local_270._M_dataplus._M_p;
      local_128.file._M_dataplus._M_p = (pointer)&local_128.file.field_2;
      pcVar2 = (pCVar9->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_128,pcVar2,pcVar2 + (pCVar9->file)._M_string_length);
      local_128.line = pCVar9->line;
      p_Var11 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_char>_>::
                GetSetUpCaseOrSuite((pCVar9->file)._M_dataplus._M_p,local_128.line);
      p_Var12 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_char>_>::
                GetTearDownCaseOrSuite((pCVar9->file)._M_dataplus._M_p,pCVar9->line);
      pTVar13 = (TestFactoryBase *)operator_new(8);
      pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00237130;
      MakeAndRegisterTestInfo
                (local_248->_M_local_buf,(char *)plVar10,_Var3._M_p,(char *)0x0,&local_128,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_char>>::dummy_,
                 p_Var11,p_Var12,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_128.file._M_dataplus._M_p != &local_128.file.field_2) {
        operator_delete(local_128.file._M_dataplus._M_p,
                        local_128.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if (local_1f8 != (long *)&local_1e8) {
        operator_delete(local_1f8,CONCAT71(uStack_1e7,local_1e8) + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.file._M_dataplus._M_p != &local_298.file.field_2) {
        operator_delete(local_298.file._M_dataplus._M_p,
                        local_298.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.file._M_dataplus._M_p != &local_240.file.field_2) {
        operator_delete(local_240.file._M_dataplus._M_p,
                        local_240.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170.file._M_dataplus._M_p != &local_170.file.field_2) {
        operator_delete(local_170.file._M_dataplus._M_p,
                        local_170.file.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8,local_2c8 + 1);
      }
      local_2b8 = &local_2a8;
      local_2a8 = CONCAT44(local_2a8._4_4_,0x533255);
      local_2b0 = 3;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_2d8 = &local_2c8;
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_2c8 = *plVar15;
        lStack_2c0 = plVar10[3];
      }
      else {
        local_2c8 = *plVar15;
        local_2d8 = (long *)*plVar10;
      }
      local_2d0 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_2f8 = &local_2e8;
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_2e8 = *plVar15;
        lStack_2e0 = plVar10[3];
      }
      else {
        local_2e8 = *plVar15;
        local_2f8 = (long *)*plVar10;
      }
      local_2f0 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2f8);
      local_240.file._M_dataplus._M_p = (pointer)&local_240.file.field_2;
      psVar16 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_240.file.field_2._M_allocated_capacity = *psVar16;
        local_240.file.field_2._8_8_ = plVar10[3];
      }
      else {
        local_240.file.field_2._M_allocated_capacity = *psVar16;
        local_240.file._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_240.file._M_string_length = plVar10[1];
      *plVar10 = (long)psVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_240,*(ulong *)(*(long *)local_178 + 0x20));
      local_298.file._M_dataplus._M_p = (pointer)&local_298.file.field_2;
      psVar16 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_298.file.field_2._M_allocated_capacity = *psVar16;
        local_298.file.field_2._8_8_ = plVar10[3];
      }
      else {
        local_298.file.field_2._M_allocated_capacity = *psVar16;
        local_298.file._M_dataplus._M_p = (pointer)*plVar10;
      }
      _Var3._M_p = local_298.file._M_dataplus._M_p;
      local_298.file._M_string_length = plVar10[1];
      *plVar10 = (long)psVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pcVar21 = strchr(pcVar7,0x2c);
      if (pcVar21 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_1d8,pcVar7,(allocator *)&local_170);
        ptVar17 = extraout_RDX_20;
      }
      else {
        local_1d8 = &local_1c8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1d8,pcVar7,pcVar21);
        ptVar17 = extraout_RDX_19;
      }
      local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var3._M_p;
      paVar14 = local_1d8;
      if (local_1d0 != 0) {
        pcVar21 = local_1d8->_M_local_buf + local_1d0;
        do {
          paVar5 = local_1d8;
          iVar6 = isspace((uint)(byte)pcVar21[-1]);
          ptVar17 = extraout_RDX_21;
          paVar14 = paVar5;
          if (iVar6 == 0) break;
          pcVar18 = pcVar21 + -1;
          uVar23 = (long)pcVar18 - (long)paVar5;
          std::__cxx11::string::_M_erase((ulong)&local_1d8,uVar23);
          pcVar21 = local_1d8->_M_local_buf + uVar23;
          ptVar17 = extraout_RDX_22;
          paVar14 = local_1d8;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar18 != paVar5);
      }
      pCVar9 = local_250;
      local_1d8 = &local_1c8;
      if (paVar14 == local_1d8) {
        local_270.field_2._8_8_ = local_1c8._8_8_;
        paVar14 = &local_270.field_2;
      }
      local_270.field_2._M_allocated_capacity._1_7_ = local_1c8._M_allocated_capacity._1_7_;
      local_270.field_2._M_local_buf[0] = local_1c8._M_local_buf[0];
      local_270._M_string_length = local_1d0;
      local_1d0 = 0;
      local_1c8._M_local_buf[0] = '\0';
      local_270._M_dataplus._M_p = (pointer)paVar14;
      GetTypeName_abi_cxx11_(&local_218,(internal *)&unsigned_int::typeinfo,ptVar17);
      _Var3._M_p = local_218._M_dataplus._M_p;
      local_170.file._M_dataplus._M_p = (pointer)&local_170.file.field_2;
      pcVar2 = (pCVar9->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_170,pcVar2,pcVar2 + (pCVar9->file)._M_string_length);
      local_170.line = pCVar9->line;
      p_Var11 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_int>_>::
                GetSetUpCaseOrSuite((pCVar9->file)._M_dataplus._M_p,local_170.line);
      p_Var12 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_int>_>::
                GetTearDownCaseOrSuite((pCVar9->file)._M_dataplus._M_p,pCVar9->line);
      pTVar13 = (TestFactoryBase *)operator_new(8);
      pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002371c8;
      MakeAndRegisterTestInfo
                (local_248->_M_local_buf,paVar14->_M_local_buf,_Var3._M_p,(char *)0x0,&local_170,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_int>>::dummy_,
                 p_Var11,p_Var12,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_170.file._M_dataplus._M_p != &local_170.file.field_2) {
        operator_delete(local_170.file._M_dataplus._M_p,
                        local_170.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if (local_1d8 != &local_1c8) {
        operator_delete(local_1d8,
                        CONCAT71(local_1c8._M_allocated_capacity._1_7_,local_1c8._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.file._M_dataplus._M_p != &local_298.file.field_2) {
        operator_delete(local_298.file._M_dataplus._M_p,
                        local_298.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.file._M_dataplus._M_p != &local_240.file.field_2) {
        operator_delete(local_240.file._M_dataplus._M_p,
                        local_240.file.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8,local_2c8 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      local_270.field_2._M_allocated_capacity._0_4_ = 0x533255;
      local_270._M_string_length = 3;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_2b8 = &local_2a8;
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_2a8 = *plVar15;
        lStack_2a0 = plVar10[3];
      }
      else {
        local_2a8 = *plVar15;
        local_2b8 = (long *)*plVar10;
      }
      local_2b0 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_2d8 = &local_2c8;
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_2c8 = *plVar15;
        lStack_2c0 = plVar10[3];
      }
      else {
        local_2c8 = *plVar15;
        local_2d8 = (long *)*plVar10;
      }
      local_2d0 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2d8);
      local_2f8 = &local_2e8;
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_2e8 = *plVar15;
        lStack_2e0 = plVar10[3];
      }
      else {
        local_2e8 = *plVar15;
        local_2f8 = (long *)*plVar10;
      }
      local_2f0 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_2f8,*(ulong *)(*(long *)local_178 + 0x40));
      local_298.file._M_dataplus._M_p = (pointer)&local_298.file.field_2;
      psVar16 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_298.file.field_2._M_allocated_capacity = *psVar16;
        local_298.file.field_2._8_8_ = plVar10[3];
      }
      else {
        local_298.file.field_2._M_allocated_capacity = *psVar16;
        local_298.file._M_dataplus._M_p = (pointer)*plVar10;
      }
      _Var3._M_p = local_298.file._M_dataplus._M_p;
      local_298.file._M_string_length = plVar10[1];
      *plVar10 = (long)psVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pcVar21 = strchr(pcVar7,0x2c);
      if (pcVar21 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_1b8,pcVar7,(allocator *)&local_240);
        ptVar17 = extraout_RDX_24;
      }
      else {
        local_1b8 = &local_1a8;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_1b8,pcVar7,pcVar21);
        ptVar17 = extraout_RDX_23;
      }
      local_248 = (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                   *)_Var3._M_p;
      paVar14 = local_1b8;
      if (local_1b0 != 0) {
        pcVar21 = local_1b8->_M_local_buf + local_1b0;
        do {
          paVar5 = local_1b8;
          iVar6 = isspace((uint)(byte)pcVar21[-1]);
          ptVar17 = extraout_RDX_25;
          paVar14 = paVar5;
          if (iVar6 == 0) break;
          pcVar18 = pcVar21 + -1;
          uVar23 = (long)pcVar18 - (long)paVar5;
          std::__cxx11::string::_M_erase((ulong)&local_1b8,uVar23);
          pcVar21 = local_1b8->_M_local_buf + uVar23;
          ptVar17 = extraout_RDX_26;
          paVar14 = local_1b8;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar18 != paVar5);
      }
      pCVar9 = local_250;
      local_1b8 = &local_1a8;
      if (paVar14 == local_1b8) {
        local_218.field_2._8_8_ = local_1a8._8_8_;
        paVar14 = &local_218.field_2;
      }
      local_218.field_2._M_allocated_capacity._1_7_ = local_1a8._M_allocated_capacity._1_7_;
      local_218.field_2._M_local_buf[0] = local_1a8._M_local_buf[0];
      local_218._M_string_length = local_1b0;
      local_1b0 = 0;
      local_1a8._M_local_buf[0] = '\0';
      local_218._M_dataplus._M_p = (pointer)paVar14;
      GetTypeName_abi_cxx11_(&local_148,(internal *)&unsigned_long::typeinfo,ptVar17);
      _Var3._M_p = local_148._M_dataplus._M_p;
      local_240.file._M_dataplus._M_p = (pointer)&local_240.file.field_2;
      pcVar2 = (pCVar9->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_240,pcVar2,pcVar2 + (pCVar9->file)._M_string_length);
      local_240.line = pCVar9->line;
      p_Var11 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long>_>::
                GetSetUpCaseOrSuite((pCVar9->file)._M_dataplus._M_p,local_240.line);
      p_Var12 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long>_>::
                GetTearDownCaseOrSuite((pCVar9->file)._M_dataplus._M_p,pCVar9->line);
      pTVar13 = (TestFactoryBase *)operator_new(8);
      pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_00237260;
      MakeAndRegisterTestInfo
                (local_248->_M_local_buf,paVar14->_M_local_buf,_Var3._M_p,(char *)0x0,&local_240,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long>>::dummy_,
                 p_Var11,p_Var12,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_240.file._M_dataplus._M_p != &local_240.file.field_2) {
        operator_delete(local_240.file._M_dataplus._M_p,
                        local_240.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if (local_1b8 != &local_1a8) {
        operator_delete(local_1b8,
                        CONCAT71(local_1a8._M_allocated_capacity._1_7_,local_1a8._M_local_buf[0]) +
                        1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.file._M_dataplus._M_p != &local_298.file.field_2) {
        operator_delete(local_298.file._M_dataplus._M_p,
                        local_298.file.field_2._M_allocated_capacity + 1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8,local_2c8 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      local_218._M_dataplus._M_p = (pointer)&local_218.field_2;
      local_218.field_2._M_allocated_capacity._0_4_ = 0x533255;
      local_218._M_string_length = 3;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_218);
      local_270._M_dataplus._M_p = (pointer)&local_270.field_2;
      psVar16 = (size_type *)(plVar10 + 2);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)*plVar10 ==
          (anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)psVar16) {
        local_270.field_2._M_allocated_capacity = *psVar16;
        local_270.field_2._8_8_ = plVar10[3];
      }
      else {
        local_270.field_2._M_allocated_capacity = *psVar16;
        local_270._M_dataplus._M_p = (pointer)*plVar10;
      }
      local_270._M_string_length = plVar10[1];
      *plVar10 = (long)psVar16;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_270);
      local_2b8 = &local_2a8;
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_2a8 = *plVar15;
        lStack_2a0 = plVar10[3];
      }
      else {
        local_2a8 = *plVar15;
        local_2b8 = (long *)*plVar10;
      }
      local_2b0 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::append((char *)&local_2b8);
      local_2d8 = &local_2c8;
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_2c8 = *plVar15;
        lStack_2c0 = plVar10[3];
      }
      else {
        local_2c8 = *plVar15;
        local_2d8 = (long *)*plVar10;
      }
      local_2d0 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      plVar10 = (long *)std::__cxx11::string::_M_append
                                  ((char *)&local_2d8,*(ulong *)(*(long *)local_178 + 0x60));
      local_2f8 = &local_2e8;
      plVar15 = plVar10 + 2;
      if ((long *)*plVar10 == plVar15) {
        local_2e8 = *plVar15;
        lStack_2e0 = plVar10[3];
      }
      else {
        local_2e8 = *plVar15;
        local_2f8 = (long *)*plVar10;
      }
      plVar20 = local_2f8;
      local_2f0 = plVar10[1];
      *plVar10 = (long)plVar15;
      plVar10[1] = 0;
      *(undefined1 *)(plVar10 + 2) = 0;
      pcVar21 = strchr(pcVar7,0x2c);
      if (pcVar21 == (char *)0x0) {
        std::__cxx11::string::string((string *)&local_198,pcVar7,(allocator *)&local_298);
        ptVar17 = extraout_RDX_28;
      }
      else {
        local_198 = &local_188;
        std::__cxx11::string::_M_construct<char_const*>((string *)&local_198,pcVar7,pcVar21);
        ptVar17 = extraout_RDX_27;
      }
      paVar14 = local_198;
      if (local_190 != 0) {
        pcVar7 = local_198->_M_local_buf + local_190;
        do {
          paVar5 = local_198;
          iVar6 = isspace((uint)(byte)pcVar7[-1]);
          ptVar17 = extraout_RDX_29;
          paVar14 = paVar5;
          if (iVar6 == 0) break;
          pcVar21 = pcVar7 + -1;
          uVar23 = (long)pcVar21 - (long)paVar5;
          std::__cxx11::string::_M_erase((ulong)&local_198,uVar23);
          pcVar7 = local_198->_M_local_buf + uVar23;
          ptVar17 = extraout_RDX_30;
          paVar14 = local_198;
        } while ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
                  *)pcVar21 != paVar5);
      }
      pCVar9 = local_250;
      local_198 = &local_188;
      if (paVar14 == local_198) {
        local_148.field_2._8_8_ = local_188._8_8_;
        paVar14 = &local_148.field_2;
      }
      local_148.field_2._M_allocated_capacity._1_7_ = local_188._M_allocated_capacity._1_7_;
      local_148.field_2._M_local_buf[0] = local_188._M_local_buf[0];
      local_148._M_string_length = local_190;
      local_190 = 0;
      local_188._M_local_buf[0] = '\0';
      local_148._M_dataplus._M_p = (pointer)paVar14;
      GetTypeName_abi_cxx11_(&local_c0,(internal *)&unsigned_long_long::typeinfo,ptVar17);
      _Var3._M_p = local_c0._M_dataplus._M_p;
      local_298.file._M_dataplus._M_p = (pointer)&local_298.file.field_2;
      pcVar2 = (pCVar9->file)._M_dataplus._M_p;
      std::__cxx11::string::_M_construct<char*>
                ((string *)&local_298,pcVar2,pcVar2 + (pCVar9->file)._M_string_length);
      local_298.line = pCVar9->line;
      p_Var11 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long_long>_>::
                GetSetUpCaseOrSuite((pCVar9->file)._M_dataplus._M_p,local_298.line);
      p_Var12 = SuiteApiResolver<gtest_suite_UnsignedToString_::Max<unsigned_long_long>_>::
                GetTearDownCaseOrSuite((pCVar9->file)._M_dataplus._M_p,pCVar9->line);
      pTVar13 = (TestFactoryBase *)operator_new(8);
      pTVar13->_vptr_TestFactoryBase = (_func_int **)&PTR__TestFactoryBase_002372f8;
      MakeAndRegisterTestInfo
                ((char *)plVar20,paVar14->_M_local_buf,_Var3._M_p,(char *)0x0,&local_298,
                 &TypeIdHelper<(anonymous_namespace)::UnsignedToString<unsigned_long_long>>::dummy_,
                 p_Var11,p_Var12,pTVar13);
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_298.file._M_dataplus._M_p != &local_298.file.field_2) {
        operator_delete(local_298.file._M_dataplus._M_p,
                        local_298.file.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_c0._M_dataplus._M_p != &local_c0.field_2) {
        operator_delete(local_c0._M_dataplus._M_p,local_c0.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_148._M_dataplus._M_p != &local_148.field_2) {
        operator_delete(local_148._M_dataplus._M_p,local_148.field_2._M_allocated_capacity + 1);
      }
      if (local_198 != &local_188) {
        operator_delete(local_198,
                        CONCAT71(local_188._M_allocated_capacity._1_7_,local_188._M_local_buf[0]) +
                        1);
      }
      if (local_2f8 != &local_2e8) {
        operator_delete(local_2f8,local_2e8 + 1);
      }
      if (local_2d8 != &local_2c8) {
        operator_delete(local_2d8,local_2c8 + 1);
      }
      if (local_2b8 != &local_2a8) {
        operator_delete(local_2b8,local_2a8 + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_270._M_dataplus._M_p != &local_270.field_2) {
        operator_delete(local_270._M_dataplus._M_p,local_270.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)local_218._M_dataplus._M_p != &local_218.field_2) {
        operator_delete(local_218._M_dataplus._M_p,local_218.field_2._M_allocated_capacity + 1);
      }
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)test_name_1._M_dataplus._M_p != &test_name_1.field_2) {
        operator_delete(test_name_1._M_dataplus._M_p,test_name_1.field_2._M_allocated_capacity + 1);
      }
      if (local_58[0] != (internal *)local_48) {
        operator_delete(local_58[0],local_48[0] + 1);
      }
      paVar14 = &test_name.field_2;
      if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
           *)test_name._M_dataplus._M_p != paVar14) {
        operator_delete(test_name._M_dataplus._M_p,test_name.field_2._M_allocated_capacity + 1);
        paVar14 = extraout_RAX;
      }
      return SUB81(paVar14,0);
    }
  }
  FormatFileLocation_abi_cxx11_(&local_298.file,local_58[0],(char *)(ulong)local_38,iVar6);
  TypeParameterizedTestSuite<(anonymous_namespace)::UnsignedToString,testing::internal::Templates<gtest_suite_UnsignedToString_::Ten,gtest_suite_UnsignedToString_::Max>,testing::internal::Types<unsigned_char,unsigned_int,unsigned_long,unsigned_long_long>>
  ::Register();
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_name_1._M_dataplus._M_p != &test_name_1.field_2) {
    operator_delete(test_name_1._M_dataplus._M_p,test_name_1.field_2._M_allocated_capacity + 1);
  }
  if (local_58[0] != (internal *)local_48) {
    operator_delete(local_58[0],local_48[0] + 1);
  }
  if ((anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
       *)test_name._M_dataplus._M_p != &test_name.field_2) {
    operator_delete(test_name._M_dataplus._M_p,test_name.field_2._M_allocated_capacity + 1);
  }
  _Unwind_Resume(extraout_RAX_00);
}

Assistant:

static bool Register(const char* prefix, CodeLocation code_location,
                       const TypedTestSuitePState* state, const char* case_name,
                       const char* test_names,
                       const std::vector<std::string>& type_names =
                           GenerateNames<DefaultNameGenerator, Types>()) {
    RegisterTypeParameterizedTestSuiteInstantiation(case_name);
    std::string test_name = StripTrailingSpaces(
        GetPrefixUntilComma(test_names));
    if (!state->TestExists(test_name)) {
      fprintf(stderr, "Failed to get code location for test %s.%s at %s.",
              case_name, test_name.c_str(),
              FormatFileLocation(code_location.file.c_str(),
                                 code_location.line).c_str());
      fflush(stderr);
      posix::Abort();
    }
    const CodeLocation& test_location = state->GetCodeLocation(test_name);

    typedef typename Tests::Head Head;

    // First, register the first test in 'Test' for each type in 'Types'.
    TypeParameterizedTest<Fixture, Head, Types>::Register(
        prefix, test_location, case_name, test_names, 0, type_names);

    // Next, recurses (at compile time) with the tail of the test list.
    return TypeParameterizedTestSuite<Fixture, typename Tests::Tail,
                                      Types>::Register(prefix, code_location,
                                                       state, case_name,
                                                       SkipComma(test_names),
                                                       type_names);
  }